

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

longlong QUtil::string_to_ll(char *str)

{
  int *piVar1;
  range_error *this;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  longlong local_18;
  longlong result;
  char *str_local;
  
  result = (longlong)str;
  piVar1 = __errno_location();
  *piVar1 = 0;
  local_18 = strtoll((char *)result,(char **)0x0,10);
  piVar1 = __errno_location();
  if (*piVar1 == 0x22) {
    this = (range_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"overflow/underflow converting ",&local_79);
    std::operator+(&local_58,&local_78,(char *)result);
    std::operator+(&local_38,&local_58," to 64-bit integer");
    std::range_error::range_error(this,(string *)&local_38);
    __cxa_throw(this,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  return local_18;
}

Assistant:

long long
QUtil::string_to_ll(char const* str)
{
    errno = 0;
#ifdef _MSC_VER
    long long result = _strtoi64(str, 0, 10);
#else
    long long result = strtoll(str, nullptr, 10);
#endif
    if (errno == ERANGE) {
        throw std::range_error(
            std::string("overflow/underflow converting ") + str + " to 64-bit integer");
    }
    return result;
}